

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

iterator * __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::begin(iterator *__return_storage_ptr__,
       hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,database *db)

{
  iterator *piVar1;
  iterator *extraout_RAX;
  pointer *__ptr;
  
  __return_storage_ptr__->db_ = db;
  piVar1 = (iterator *)memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
  __return_storage_ptr__->index_ = this;
  (__return_storage_ptr__->pos_)._M_t.
  super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((this->root_).internal_ != (internal_node *)0x0) {
    iterator_base<false>::move_to_left_most_child(__return_storage_ptr__,this->root_);
    piVar1 = extraout_RAX;
  }
  return piVar1;
}

Assistant:

iterator begin (database & db) { return make_begin_iterator (db, *this); }